

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::fea::ChElementShellReissner4::EvaluatePT
          (ChVector<double> *__return_storage_ptr__,ChElementShellReissner4 *this,int ipt)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  double dVar7;
  double dVar8;
  pointer psVar9;
  long lVar10;
  long lVar11;
  ChVector<double> *v;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  psVar9 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar5 = (psVar9->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  this_00 = (psVar9->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      psVar9 = (this->m_nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  lVar10 = (long)ipt;
  this_01 = psVar9[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  lVar11 = lVar10 * 0x10;
  dVar12 = (double)(&xi_n)[lVar10 * 2];
  dVar13 = *(double *)(&DAT_00b618e8 + lVar11);
  pdVar1 = (double *)(&xi_n + lVar10 * 2);
  peVar6 = psVar9[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar16 = dVar13 + 1.0;
  dVar7 = (dVar12 + 1.0) * 0.25 * dVar16;
  dVar14 = *(double *)((long)&peVar5->super_ChNodeFEAbase + 0x20);
  dVar2 = *(double *)&peVar5->field_0x30;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
      dVar13 = *(double *)(&DAT_00b618e8 + lVar11);
      dVar12 = *pdVar1;
      psVar9 = (this->m_nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar16 = dVar13 + 1.0;
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  dVar15 = (1.0 - dVar12) * 0.25;
  this_02 = psVar9[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  dVar16 = dVar15 * dVar16;
  dVar8 = *(double *)((long)&peVar6->super_ChNodeFEAbase + 0x20);
  dVar3 = *(double *)&peVar6->field_0x30;
  peVar5 = psVar9[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
      dVar12 = *pdVar1;
      dVar13 = *(double *)(&DAT_00b618e8 + lVar11);
      psVar9 = (this->m_nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar15 = (1.0 - dVar12) * 0.25;
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  dVar13 = 1.0 - dVar13;
  this_03 = psVar9[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  dVar15 = dVar15 * dVar13;
  dVar4 = *(double *)&peVar5->field_0x30;
  peVar6 = psVar9[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar14 = dVar7 * dVar14 + dVar16 * dVar8 +
           dVar15 * *(double *)((long)&peVar5->super_ChNodeFEAbase + 0x20);
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_03->_M_use_count = this_03->_M_use_count + 1;
      UNLOCK();
      dVar13 = 1.0 - *(double *)(&DAT_00b618e8 + lVar11);
      dVar12 = *pdVar1;
    }
    else {
      this_03->_M_use_count = this_03->_M_use_count + 1;
    }
  }
  dVar13 = (dVar12 + 1.0) * 0.25 * dVar13;
  dVar12 = *(double *)&peVar6->field_0x30;
  dVar8 = *(double *)&peVar6->field_0x28;
  __return_storage_ptr__->m_data[0] =
       dVar14 + dVar13 * *(double *)((long)&peVar6->super_ChNodeFEAbase + 0x20);
  __return_storage_ptr__->m_data[1] = dVar14 + dVar13 * dVar8;
  __return_storage_ptr__->m_data[2] =
       dVar7 * dVar2 + dVar16 * dVar3 + dVar15 * dVar4 + dVar13 * dVar12;
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementShellReissner4::EvaluatePT(int ipt) {
    return GetNodeA()->GetPos() * L1(xi_n[ipt]) + GetNodeB()->GetPos() * L2(xi_n[ipt]) +
           GetNodeC()->GetPos() * L3(xi_n[ipt]) + GetNodeD()->GetPos() * L4(xi_n[ipt]);
}